

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsCore.c
# Opt level: O0

int Abc_NtkMfsResub(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  Abc_Ntk_t *pAVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t **ppAVar6;
  abctime aVar7;
  Aig_Man_t *pAVar8;
  Cnf_Dat_t *pCVar9;
  sat_solver *psVar10;
  abctime clk;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  p->nNodesTried = p->nNodesTried + 1;
  Mfs_ManClean(p);
  aVar4 = Abc_Clock();
  pVVar5 = Abc_MfsComputeRoots(pNode,p->pPars->nWinTfoLevs,p->pPars->nFanoutsMax);
  p->vRoots = pVVar5;
  pAVar1 = p->pNtk;
  ppAVar6 = (Abc_Obj_t **)Vec_PtrArray(p->vRoots);
  iVar2 = Vec_PtrSize(p->vRoots);
  pVVar5 = Abc_NtkNodeSupport(pAVar1,ppAVar6,iVar2);
  p->vSupp = pVVar5;
  pAVar1 = p->pNtk;
  ppAVar6 = (Abc_Obj_t **)Vec_PtrArray(p->vRoots);
  iVar2 = Vec_PtrSize(p->vRoots);
  pVVar5 = Abc_NtkDfsNodes(pAVar1,ppAVar6,iVar2);
  p->vNodes = pVVar5;
  aVar7 = Abc_Clock();
  p->timeWin = (aVar7 - aVar4) + p->timeWin;
  if ((p->pPars->nWinMax == 0) || (iVar2 = Vec_PtrSize(p->vNodes), iVar2 <= p->pPars->nWinMax)) {
    aVar4 = Abc_Clock();
    iVar2 = Abc_ObjRequiredLevel(pNode);
    pVVar5 = Abc_MfsComputeDivisors(p,pNode,iVar2 + -1);
    p->vDivs = pVVar5;
    iVar2 = Vec_PtrSize(p->vDivs);
    iVar3 = Abc_ObjFaninNum(pNode);
    p->nTotalDivs = (iVar2 - iVar3) + p->nTotalDivs;
    aVar7 = Abc_Clock();
    p->timeDiv = (aVar7 - aVar4) + p->timeDiv;
    aVar4 = Abc_Clock();
    pAVar8 = Abc_NtkConstructAig(p,pNode);
    p->pAigWin = pAVar8;
    aVar7 = Abc_Clock();
    p->timeAig = (aVar7 - aVar4) + p->timeAig;
    aVar4 = Abc_Clock();
    pAVar8 = p->pAigWin;
    iVar2 = Vec_PtrSize(p->vDivs);
    pCVar9 = Cnf_DeriveSimple(pAVar8,iVar2 + 1);
    p->pCnf = pCVar9;
    aVar7 = Abc_Clock();
    p->timeCnf = (aVar7 - aVar4) + p->timeCnf;
    aVar4 = Abc_Clock();
    psVar10 = Abc_MfsCreateSolverResub(p,(int *)0x0,0,0);
    p->pSat = psVar10;
    if (p->pSat == (sat_solver *)0x0) {
      p->nNodesBad = p->nNodesBad + 1;
    }
    else {
      if (p->pPars->fPower == 0) {
        if (p->pPars->fSwapEdge == 0) {
          Abc_NtkMfsResubNode(p,pNode);
          if (p->pPars->fMoreEffort != 0) {
            Abc_NtkMfsResubNode2(p,pNode);
          }
        }
        else {
          Abc_NtkMfsEdgeSwapEval(p,pNode);
        }
      }
      else {
        Abc_NtkMfsEdgePower(p,pNode);
      }
      aVar7 = Abc_Clock();
      p->timeSat = (aVar7 - aVar4) + p->timeSat;
    }
  }
  else {
    p->nMaxDivs = p->nMaxDivs + 1;
  }
  return 1;
}

Assistant:

int Abc_NtkMfsResub( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    abctime clk;
    p->nNodesTried++;
    // prepare data structure for this node
    Mfs_ManClean( p );
    // compute window roots, window support, and window nodes
clk = Abc_Clock();
    p->vRoots = Abc_MfsComputeRoots( pNode, p->pPars->nWinTfoLevs, p->pPars->nFanoutsMax );
    p->vSupp  = Abc_NtkNodeSupport( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
    p->vNodes = Abc_NtkDfsNodes( p->pNtk, (Abc_Obj_t **)Vec_PtrArray(p->vRoots), Vec_PtrSize(p->vRoots) );
p->timeWin += Abc_Clock() - clk;
    if ( p->pPars->nWinMax && Vec_PtrSize(p->vNodes) > p->pPars->nWinMax )
    {
        p->nMaxDivs++;
        return 1;
    }
    // compute the divisors of the window
clk = Abc_Clock();
    p->vDivs  = Abc_MfsComputeDivisors( p, pNode, Abc_ObjRequiredLevel(pNode) - 1 );
    p->nTotalDivs += Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode);
p->timeDiv += Abc_Clock() - clk;
    // construct AIG for the window
clk = Abc_Clock();
    p->pAigWin = Abc_NtkConstructAig( p, pNode );
p->timeAig += Abc_Clock() - clk;
    // translate it into CNF
clk = Abc_Clock();
    p->pCnf = Cnf_DeriveSimple( p->pAigWin, 1 + Vec_PtrSize(p->vDivs) );
p->timeCnf += Abc_Clock() - clk;
    // create the SAT problem
clk = Abc_Clock();
    p->pSat = Abc_MfsCreateSolverResub( p, NULL, 0, 0 );
    if ( p->pSat == NULL )
    {
        p->nNodesBad++;
        return 1;
    }
//clk = Abc_Clock();
//    if ( p->pPars->fGiaSat )
//        Abc_NtkMfsConstructGia( p );
//p->timeGia += Abc_Clock() - clk;
    // solve the SAT problem
    if ( p->pPars->fPower )
        Abc_NtkMfsEdgePower( p, pNode );
    else if ( p->pPars->fSwapEdge )
        Abc_NtkMfsEdgeSwapEval( p, pNode );
    else
    {
        Abc_NtkMfsResubNode( p, pNode );
        if ( p->pPars->fMoreEffort )
            Abc_NtkMfsResubNode2( p, pNode );
    }
p->timeSat += Abc_Clock() - clk;
//    if ( p->pPars->fGiaSat )
//        Abc_NtkMfsDeconstructGia( p );
    return 1;
}